

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase<Catch::XmlReporter>::testGroupStarting
          (StreamingReporterBase<Catch::XmlReporter> *this,GroupInfo *_groupInfo)

{
  LazyStat<Catch::GroupInfo>::operator=(&this->currentGroupInfo,_groupInfo);
  return;
}

Assistant:

void testGroupStarting(GroupInfo const& _groupInfo) override {
            currentGroupInfo = _groupInfo;
        }